

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/3rdparty/Catch2/catch.hpp:9713:44)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]semver_test_3rdparty_Catch2_catch_hpp:9713:44)>
          *this,string *arg)

{
  ConfigData *pCVar1;
  pointer pbVar2;
  char cVar3;
  istream *piVar4;
  string *this_00;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_2a8;
  BasicResult<Catch::clara::detail::ParseResultType> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream f;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&temp,arg);
  local_288.m_errorMessage._M_dataplus._M_p = (pointer)&local_288.m_errorMessage.field_2;
  local_288.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type =
       Ok;
  local_288.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0
  ;
  local_288.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_00189ad8;
  local_288.m_errorMessage._M_string_length = 0;
  local_288.m_errorMessage.field_2._M_local_buf[0] = '\0';
  ::std::ifstream::ifstream(&f,temp._M_dataplus._M_p,_S_in);
  cVar3 = ::std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
LAB_00129427:
    do {
      piVar4 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&f,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) goto LAB_00129531;
      trim(&local_2a8,&line);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&line,&local_2a8);
      ::std::__cxx11::string::~string((string *)&local_2a8);
      if (line._M_string_length != 0) {
        if (*line._M_dataplus._M_p != '\"') {
          if (*line._M_dataplus._M_p == '#') goto LAB_00129427;
          ::std::operator+(&local_258,'\"',&line);
          ::std::operator+(&local_2a8,&local_258,'\"');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&line,&local_2a8);
          ::std::__cxx11::string::~string((string *)&local_2a8);
          ::std::__cxx11::string::~string((string *)&local_258);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&((this->m_lambda).config)->testsOrTags,&line);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[2]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &((this->m_lambda).config)->testsOrTags,(char (*) [2])",");
      }
    } while( true );
  }
  ::std::operator+(&local_2a8,"Unable to load input file: \'",&temp);
  ::std::operator+(&line,&local_2a8,"\'");
  BasicResult<Catch::clara::detail::ParseResultType>::runtimeError(__return_storage_ptr__,&line);
  ::std::__cxx11::string::~string((string *)&line);
  this_00 = &local_2a8;
LAB_0012957f:
  ::std::__cxx11::string::~string((string *)this_00);
  ::std::ifstream::~ifstream(&f);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_288);
  ::std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
LAB_00129531:
  pCVar1 = (this->m_lambda).config;
  pbVar2 = (pCVar1->testsOrTags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pCVar1->testsOrTags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&pCVar1->testsOrTags,pbVar2 + -1);
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00189ad8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  this_00 = &line;
  goto LAB_0012957f;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }